

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

object_validator __thiscall goodform::sub_form::object(sub_form *this)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *value;
  allocator<char> local_61;
  string local_60;
  error_message local_40;
  sub_form *local_20;
  sub_form *this_local;
  
  local_20 = this;
  bVar1 = is<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                    (this->variant_);
  if (bVar1) {
    value = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                      (this->variant_);
    object_validator::object_validator((object_validator *)&this_local,value,this->error_);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"NOT AN OBJECT",&local_61);
    error_message::error_message(&local_40,&local_60);
    error_message::operator=(this->error_,&local_40);
    error_message::~error_message(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    object_validator::object_validator
              ((object_validator *)&this_local,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                *)const_object_abi_cxx11_,this->error_);
  }
  return _this_local;
}

Assistant:

object_validator sub_form::object()
  {
    if (!is<goodform::object_t>(this->variant_))
    {
      this->error_ = error_message("NOT AN OBJECT");
      return object_validator(const_object, this->error_);
    }
    else
    {
      return object_validator(get<goodform::object_t>(this->variant_), this->error_);
    }
  }